

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_ADD_zzi(DisasContext_conflict1 *s,arg_rri_esz *a)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  _Bool _Var2;
  
  tcg_ctx = s->uc->tcg_ctx;
  if ((a->esz == 0) && ((s->insn & 0x2000) != 0)) {
    _Var2 = false;
  }
  else {
    _Var1 = sve_access_check_aarch64(s);
    _Var2 = true;
    if (_Var1) {
      tcg_gen_gvec_addi_aarch64
                (tcg_ctx,a->esz,a->rd * 0x100 + 0xc10,a->rn * 0x100 + 0xc10,(long)a->imm,s->sve_len,
                 s->sve_len);
    }
  }
  return _Var2;
}

Assistant:

static bool trans_ADD_zzi(DisasContext *s, arg_rri_esz *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->esz == 0 && extract32(s->insn, 13, 1)) {
        return false;
    }
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        tcg_gen_gvec_addi(tcg_ctx, a->esz, vec_full_reg_offset(s, a->rd),
                          vec_full_reg_offset(s, a->rn), a->imm, vsz, vsz);
    }
    return true;
}